

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O2

optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> * __thiscall
libtorrent::http_parser::header_duration
          (optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> *__return_storage_ptr__,
          http_parser *this,string_view key)

{
  bool bVar1;
  const_iterator cVar2;
  long lVar3;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  size_t local_28;
  
  local_28 = key.len_;
  local_30 = key.ptr_;
  boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
            (&local_50,(basic_string_view<char,std::char_traits<char>> *)&local_30,&local_51);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_header)._M_t,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->m_header)._M_t._M_impl.super__Rb_tree_header) {
    lVar3 = atol(*(char **)(cVar2._M_node + 2));
    if (0 < lVar3) {
      (__return_storage_ptr__->super_type).m_storage.dummy_ = SUB84(lVar3,0);
      bVar1 = true;
      goto LAB_001cc043;
    }
  }
  bVar1 = false;
LAB_001cc043:
  (__return_storage_ptr__->super_type).m_initialized = bVar1;
  return __return_storage_ptr__;
}

Assistant:

boost::optional<seconds32> http_parser::header_duration(string_view const key) const
	{
		// TODO: remove to_string() if we're in C++14
		auto const i = m_header.find(key.to_string());
		if (i == m_header.end()) return boost::none;
		auto const val = std::atol(i->second.c_str());
		if (val <= 0) return boost::none;
		return seconds32(val);
	}